

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

void __thiscall ObjectTest_set_string_Test::TestBody(ObjectTest_set_string_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
  *paVar1;
  byte bVar2;
  char *pcVar3;
  object obj;
  AssertHelper local_c0 [8];
  Message local_b8;
  undefined7 uStack_b7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  char8_t *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  char8_t local_98;
  undefined7 uStack_97;
  undefined4 uStack_8f;
  undefined2 uStack_8b;
  char8_t cStack_89;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_88;
  _Variadic_union<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  local_68;
  char local_38;
  
  local_68._M_first._M_storage = (_Uninitialized<void_*,_true>)(void *)0x0;
  local_38 = '\0';
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<4ul,char8_t_const(&)[8]>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_68._M_first,(char8_t (*) [8])"Jessica");
  local_a8 = (char8_t *)CONCAT71(local_a8._1_7_,local_38 == '\x04');
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 != '\x04') {
    testing::Message::Message(&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_88,(char *)&local_a8,"obj.has<std::u8string>()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x397,local_88._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,
                      CONCAT44(local_88.field_2._M_allocated_capacity._4_4_,
                               local_88.field_2._M_allocated_capacity._0_4_) + 1);
    }
    if ((long *)CONCAT71(uStack_b7,local_b8) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(uStack_b7,local_b8) + 8))();
    }
    if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a0,local_a0);
    }
  }
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_98 = '\0';
  paVar1 = &local_88.field_2;
  local_a8 = &local_98;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  if (local_38 == '\x04') {
    std::__cxx11::u8string::_M_construct<char8_t*>
              ((u8string *)&local_88,local_68._M_first._M_storage,
               local_68._8_8_ + (long)local_68._M_first._M_storage);
  }
  else {
    local_88.field_2._M_allocated_capacity._1_3_ = (undefined3)uStack_97;
    local_88.field_2._M_allocated_capacity._0_4_ =
         (uint)(uint3)local_88.field_2._M_allocated_capacity._1_3_ << 8;
    local_88.field_2._M_allocated_capacity._4_4_ = (undefined4)((uint7)uStack_97 >> 0x18);
    local_88.field_2._9_4_ = uStack_8f;
    local_88.field_2._13_2_ = uStack_8b;
    local_88.field_2._M_local_buf[0xf] = cStack_89;
    local_88._M_string_length = 0;
    local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_98 = '\0';
  }
  testing::internal::CmpHelperEQ<std::__cxx11::u8string,char8_t[8]>
            ((internal *)&local_b8,"obj.get<std::u8string>()","u8\"Jessica\"",&local_88,
             (char8_t (*) [8])"Jessica");
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT44(local_88.field_2._M_allocated_capacity._4_4_,
                             local_88.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8,CONCAT71(uStack_97,local_98) + 1);
  }
  if (local_b8 == (Message)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x398,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_88._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_88._M_dataplus._M_p + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 == '\x01') {
    local_a8._0_1_ = (AssertHelper)(local_38 != '\x01');
    testing::Message::Message(&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_88,(char *)&local_a8,"obj.has<bool>()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x399,local_88._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p,
                      CONCAT44(local_88.field_2._M_allocated_capacity._4_4_,
                               local_88.field_2._M_allocated_capacity._0_4_) + 1);
    }
    if ((long *)CONCAT71(uStack_b7,local_b8) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(uStack_b7,local_b8) + 8))();
    }
    if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a0,local_a0);
    }
  }
  bVar2 = ~(byte)local_68._M_rest._0_1_ & 1 | local_38 != '\x01';
  local_a8 = (char8_t *)CONCAT71(local_a8._1_7_,bVar2);
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2 == 0) {
    testing::Message::Message(&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_88,(char *)&local_a8,"obj.get<bool>()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x39a,local_88._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p,
                      CONCAT44(local_88.field_2._M_allocated_capacity._4_4_,
                               local_88.field_2._M_allocated_capacity._0_4_) + 1);
    }
    if ((long *)CONCAT71(uStack_b7,local_b8) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(uStack_b7,local_b8) + 8))();
    }
    if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a0,local_a0);
    }
  }
  local_88.field_2._M_allocated_capacity._0_4_ = 0x736177;
  local_88._M_string_length = 3;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<4ul,std::__cxx11::u8string>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_68._M_first,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT44(local_88.field_2._M_allocated_capacity._4_4_,
                             local_88.field_2._M_allocated_capacity._0_4_) + 1);
  }
  local_a8 = (char8_t *)CONCAT71(local_a8._1_7_,local_38 == '\x04');
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 != '\x04') {
    testing::Message::Message(&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_88,(char *)&local_a8,"obj.has<std::u8string>()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x39e,local_88._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p,
                      CONCAT44(local_88.field_2._M_allocated_capacity._4_4_,
                               local_88.field_2._M_allocated_capacity._0_4_) + 1);
    }
    if ((long *)CONCAT71(uStack_b7,local_b8) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(uStack_b7,local_b8) + 8))();
    }
    if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a0,local_a0);
    }
  }
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_98 = '\0';
  if (local_38 == '\x04') {
    local_a8 = &local_98;
    local_88._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::u8string::_M_construct<char8_t*>
              ((u8string *)&local_88,local_68._M_first._M_storage,
               local_68._8_8_ + (long)local_68._M_first._M_storage);
  }
  else {
    local_88.field_2._M_allocated_capacity._0_4_ = (int)uStack_97 << 8;
    local_88.field_2._M_allocated_capacity._4_4_ = (undefined4)((uint7)uStack_97 >> 0x18);
    local_88.field_2._9_4_ = uStack_8f;
    local_88.field_2._13_2_ = uStack_8b;
    local_88.field_2._M_local_buf[0xf] = cStack_89;
    local_88._M_string_length = 0;
    local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_98 = '\0';
    local_a8 = &local_98;
    local_88._M_dataplus._M_p = (pointer)paVar1;
  }
  testing::internal::CmpHelperEQ<std::__cxx11::u8string,char8_t[4]>
            ((internal *)&local_b8,"obj.get<std::u8string>()","u8\"was\"",&local_88,
             (char8_t (*) [4])"was");
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT44(local_88.field_2._M_allocated_capacity._4_4_,
                             local_88.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8,CONCAT71(uStack_97,local_98) + 1);
  }
  if (local_b8 == (Message)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x39f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_88._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_88._M_dataplus._M_p + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 == '\x01') {
    local_a8._0_1_ = (AssertHelper)(local_38 != '\x01');
    testing::Message::Message(&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_88,(char *)&local_a8,"obj.has<bool>()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x3a0,local_88._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p,
                      CONCAT44(local_88.field_2._M_allocated_capacity._4_4_,
                               local_88.field_2._M_allocated_capacity._0_4_) + 1);
    }
    if ((long *)CONCAT71(uStack_b7,local_b8) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(uStack_b7,local_b8) + 8))();
    }
    if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a0,local_a0);
    }
  }
  bVar2 = ~(byte)local_68._M_rest._0_1_ & 1 | local_38 != '\x01';
  local_a8 = (char8_t *)CONCAT71(local_a8._1_7_,bVar2);
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2 == 0) {
    testing::Message::Message(&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_88,(char *)&local_a8,"obj.get<bool>()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x3a1,local_88._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p,
                      CONCAT44(local_88.field_2._M_allocated_capacity._4_4_,
                               local_88.field_2._M_allocated_capacity._0_4_) + 1);
    }
    if ((long *)CONCAT71(uStack_b7,local_b8) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(uStack_b7,local_b8) + 8))();
    }
    if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a0,local_a0);
    }
  }
  local_88._M_dataplus._M_p = "here";
  local_a8 = "";
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<4ul,char8_t_const*,char8_t_const*>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_68._M_first,(char8_t **)&local_88,&local_a8);
  local_a8 = (char8_t *)CONCAT71(local_a8._1_7_,local_38 == '\x04');
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 != '\x04') {
    testing::Message::Message(&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_88,(char *)&local_a8,"obj.has<std::u8string>()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x3a5,local_88._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p,
                      CONCAT44(local_88.field_2._M_allocated_capacity._4_4_,
                               local_88.field_2._M_allocated_capacity._0_4_) + 1);
    }
    if ((long *)CONCAT71(uStack_b7,local_b8) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(uStack_b7,local_b8) + 8))();
    }
    if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a0,local_a0);
    }
  }
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_98 = '\0';
  if (local_38 == '\x04') {
    local_a8 = &local_98;
    local_88._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::u8string::_M_construct<char8_t*>
              ((u8string *)&local_88,local_68._M_first._M_storage,
               local_68._8_8_ + (long)local_68._M_first._M_storage);
  }
  else {
    local_88.field_2._M_allocated_capacity._0_4_ = (int)uStack_97 << 8;
    local_88.field_2._M_allocated_capacity._4_4_ = (undefined4)((uint7)uStack_97 >> 0x18);
    local_88.field_2._9_4_ = uStack_8f;
    local_88.field_2._13_2_ = uStack_8b;
    local_88.field_2._M_local_buf[0xf] = cStack_89;
    local_88._M_string_length = 0;
    local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_98 = '\0';
    local_a8 = &local_98;
    local_88._M_dataplus._M_p = (pointer)paVar1;
  }
  testing::internal::CmpHelperEQ<std::__cxx11::u8string,char8_t[5]>
            ((internal *)&local_b8,"obj.get<std::u8string>()","u8\"here\"",&local_88,
             (char8_t (*) [5])0x4794b4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT44(local_88.field_2._M_allocated_capacity._4_4_,
                             local_88.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8,CONCAT71(uStack_97,local_98) + 1);
  }
  if (local_b8 == (Message)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x3a6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_88._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_88._M_dataplus._M_p + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 == '\x01') {
    local_a8._0_1_ = (AssertHelper)(local_38 != '\x01');
    testing::Message::Message(&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_88,(char *)&local_a8,"obj.has<bool>()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x3a7,local_88._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p,
                      CONCAT44(local_88.field_2._M_allocated_capacity._4_4_,
                               local_88.field_2._M_allocated_capacity._0_4_) + 1);
    }
    if ((long *)CONCAT71(uStack_b7,local_b8) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(uStack_b7,local_b8) + 8))();
    }
    if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a0,local_a0);
    }
  }
  local_a8._0_1_ = (AssertHelper)(~(byte)local_68._M_rest._0_1_ & 1 | local_38 != '\x01');
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_a8._0_1_ == (AssertHelper)0x0) {
    testing::Message::Message(&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_88,(char *)&local_a8,"obj.get<bool>()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x3a8,local_88._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p,
                      CONCAT44(local_88.field_2._M_allocated_capacity._4_4_,
                               local_88.field_2._M_allocated_capacity._0_4_) + 1);
    }
    if ((long *)CONCAT71(uStack_b7,local_b8) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(uStack_b7,local_b8) + 8))();
    }
    if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a0,local_a0);
    }
  }
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<4ul,char8_t_const(&)[1]>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_68._M_first,(char8_t (*) [1])0x486773);
  local_a8 = (char8_t *)CONCAT71(local_a8._1_7_,local_38 == '\x04');
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 != '\x04') {
    testing::Message::Message(&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_88,(char *)&local_a8,"obj.has<std::u8string>()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x3ac,local_88._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p,
                      CONCAT44(local_88.field_2._M_allocated_capacity._4_4_,
                               local_88.field_2._M_allocated_capacity._0_4_) + 1);
    }
    if ((long *)CONCAT71(uStack_b7,local_b8) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(uStack_b7,local_b8) + 8))();
    }
    if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a0,local_a0);
    }
  }
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_98 = '\0';
  if (local_38 == '\x04') {
    local_a8 = &local_98;
    local_88._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::u8string::_M_construct<char8_t*>
              ((u8string *)&local_88,local_68._M_first._M_storage,
               local_68._8_8_ + (long)local_68._M_first._M_storage);
  }
  else {
    local_88.field_2._M_allocated_capacity._0_4_ = (int)uStack_97 << 8;
    local_88.field_2._M_allocated_capacity._4_4_ = (undefined4)((uint7)uStack_97 >> 0x18);
    local_88.field_2._9_4_ = uStack_8f;
    local_88.field_2._13_2_ = uStack_8b;
    local_88.field_2._M_local_buf[0xf] = cStack_89;
    local_88._M_string_length = 0;
    local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_98 = '\0';
    local_a8 = &local_98;
    local_88._M_dataplus._M_p = (pointer)paVar1;
  }
  pcVar3 = "";
  testing::internal::CmpHelperEQ<std::__cxx11::u8string,char8_t[1]>
            ((internal *)&local_b8,"obj.get<std::u8string>()","u8\"\"",&local_88,
             (char8_t (*) [1])0x486773);
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT44(local_88.field_2._M_allocated_capacity._4_4_,
                             local_88.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8,CONCAT71(uStack_97,local_98) + 1);
  }
  if (local_b8 == (Message)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x3ad,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_88._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_88._M_dataplus._M_p + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 == '\x01') {
    local_a8._0_1_ = (AssertHelper)(local_38 != '\x01');
    testing::Message::Message(&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_88,(char *)&local_a8,"obj.has<bool>()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x3ae,local_88._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p,
                      CONCAT44(local_88.field_2._M_allocated_capacity._4_4_,
                               local_88.field_2._M_allocated_capacity._0_4_) + 1);
    }
    if ((long *)CONCAT71(uStack_b7,local_b8) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(uStack_b7,local_b8) + 8))();
    }
    if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a0,local_a0);
    }
  }
  bVar2 = ~(byte)local_68._M_rest._0_1_ & 1 | local_38 != '\x01';
  local_a8 = (char8_t *)CONCAT71(local_a8._1_7_,bVar2);
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2 == 0) {
    testing::Message::Message(&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_88,(char *)&local_a8,"obj.get<bool>()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x3af,local_88._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p,
                      CONCAT44(local_88.field_2._M_allocated_capacity._4_4_,
                               local_88.field_2._M_allocated_capacity._0_4_) + 1);
    }
    if ((long *)CONCAT71(uStack_b7,local_b8) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(uStack_b7,local_b8) + 8))();
    }
    if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a0,local_a0);
    }
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_68._M_first);
  return;
}

Assistant:

TEST(ObjectTest, set_string) {
	object obj;

	obj.set(u8"Jessica");

	EXPECT_TRUE(obj.has<std::u8string>());
	EXPECT_EQ(obj.get<std::u8string>(), u8"Jessica");
	EXPECT_FALSE(obj.has<bool>());
	EXPECT_FALSE(obj.get<bool>());

	obj.set(u8"was"s);

	EXPECT_TRUE(obj.has<std::u8string>());
	EXPECT_EQ(obj.get<std::u8string>(), u8"was");
	EXPECT_FALSE(obj.has<bool>());
	EXPECT_FALSE(obj.get<bool>());

	obj.set(u8"here"sv);

	EXPECT_TRUE(obj.has<std::u8string>());
	EXPECT_EQ(obj.get<std::u8string>(), u8"here");
	EXPECT_FALSE(obj.has<bool>());
	EXPECT_FALSE(obj.get<bool>());

	obj.set(u8"");

	EXPECT_TRUE(obj.has<std::u8string>());
	EXPECT_EQ(obj.get<std::u8string>(), u8"");
	EXPECT_FALSE(obj.has<bool>());
	EXPECT_FALSE(obj.get<bool>());
}